

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslinearlayout.cpp
# Opt level: O2

void __thiscall
QGraphicsLinearLayout::setStretchFactor
          (QGraphicsLinearLayout *this,QGraphicsLayoutItem *item,int stretch)

{
  QGraphicsLayoutItemPrivate *pQVar1;
  int iVar2;
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (item == (QGraphicsLayoutItem *)0x0) {
    local_48[0] = '\x02';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[0x14] = '\0';
    local_48[0x15] = '\0';
    local_48[0x16] = '\0';
    local_48[0x17] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_30 = "default";
    QMessageLogger::warning
              (local_48,
               "QGraphicsLinearLayout::setStretchFactor: cannot assign a stretch factor to a null item"
              );
  }
  else {
    pQVar1 = (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d;
    iVar2 = stretchFactor(this,item);
    if (iVar2 != stretch) {
      QGraphicsGridLayoutEngine::setStretchFactor
                ((QGraphicsGridLayoutEngine *)(pQVar1[1].cachedSizeHints + 1),item,stretch,
                 *(Orientation *)((long)&pQVar1[1].cachedSizeHints[0].wd + 4));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[7])
                  (this);
        return;
      }
      goto LAB_0058c9fc;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_0058c9fc:
  __stack_chk_fail();
}

Assistant:

void QGraphicsLinearLayout::setStretchFactor(QGraphicsLayoutItem *item, int stretch)
{
    Q_D(QGraphicsLinearLayout);
    if (!item) {
        qWarning("QGraphicsLinearLayout::setStretchFactor: cannot assign"
                 " a stretch factor to a null item");
        return;
    }
    if (stretchFactor(item) == stretch)
        return;
    d->engine.setStretchFactor(item, stretch, d->orientation);
    invalidate();
}